

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

xmlSchemaValPtr xmlSchemaDupVal(xmlSchemaValPtr v)

{
  xmlSchemaValType xVar1;
  _xmlSchemaVal *p_Var2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  xmlSchemaValPtr pxVar8;
  
  xVar1 = v->type;
  pxVar8 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
  if (pxVar8 != (xmlSchemaValPtr)0x0) {
    *(undefined8 *)pxVar8 = 0;
    pxVar8->next = (_xmlSchemaVal *)0x0;
    (pxVar8->value).decimal.hi = 0;
    *(undefined8 *)((long)&pxVar8->value + 0x18) = 0;
    (pxVar8->value).decimal.lo = 0;
    (pxVar8->value).decimal.mi = 0;
    pxVar8->type = xVar1;
    uVar7 = *(undefined4 *)&v->field_0x4;
    p_Var2 = v->next;
    uVar3 = (v->value).decimal.lo;
    uVar4 = (v->value).decimal.mi;
    uVar5 = (v->value).decimal.hi;
    uVar6 = *(undefined8 *)((long)&v->value + 0x18);
    pxVar8->type = v->type;
    *(undefined4 *)&pxVar8->field_0x4 = uVar7;
    pxVar8->next = p_Var2;
    (pxVar8->value).decimal.lo = uVar3;
    (pxVar8->value).decimal.mi = uVar4;
    (pxVar8->value).decimal.hi = uVar5;
    *(undefined8 *)((long)&pxVar8->value + 0x18) = uVar6;
    pxVar8->next = (_xmlSchemaVal *)0x0;
  }
  return pxVar8;
}

Assistant:

static xmlSchemaValPtr
xmlSchemaDupVal (xmlSchemaValPtr v)
{
    xmlSchemaValPtr ret = xmlSchemaNewValue(v->type);
    if (ret == NULL)
        return NULL;

    memcpy(ret, v, sizeof(xmlSchemaVal));
    ret->next = NULL;
    return ret;
}